

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

void google::protobuf::compiler::cpp::
     ForEachField<google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
               (Descriptor *d,anon_class_16_2_3fe543fb *func)

{
  long lVar1;
  long lVar2;
  
  if (0 < *(int *)(d + 0x70)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      ForEachField<google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
                ((Descriptor *)(*(long *)(d + 0x38) + lVar2),func);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x88;
    } while (lVar1 < *(int *)(d + 0x70));
  }
  if (0 < *(int *)(d + 0x7c)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      FileGenerator::GetCrossFileReferencesForField
                (func->this,(FieldDescriptor *)(*(long *)(d + 0x50) + lVar2),func->refs);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x48;
    } while (lVar1 < *(int *)(d + 0x7c));
  }
  if (0 < *(int *)(d + 4)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      FileGenerator::GetCrossFileReferencesForField
                (func->this,(FieldDescriptor *)(*(long *)(d + 0x28) + lVar2),func->refs);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x48;
    } while (lVar1 < *(int *)(d + 4));
  }
  return;
}

Assistant:

void ForEachField(const Descriptor* d, T&& func) {
  for (int i = 0; i < d->nested_type_count(); i++) {
    ForEachField(d->nested_type(i), std::forward<T&&>(func));
  }
  for (int i = 0; i < d->extension_count(); i++) {
    func(d->extension(i));
  }
  for (int i = 0; i < d->field_count(); i++) {
    func(d->field(i));
  }
}